

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

uint __thiscall
ObjectBlockPool<64,_1024>::FreePending(ObjectBlockPool<64,_1024> *this,uint *usedMemory)

{
  uint uVar1;
  SmallBlock<64> **ppSVar2;
  markerType *marker;
  MySmallBlock *block;
  uint local_20;
  uint e;
  uint i;
  uint freed;
  uint *usedMemory_local;
  ObjectBlockPool<64,_1024> *this_local;
  
  e = 0;
  local_20 = 0;
  uVar1 = FastVector<SmallBlock<64>_*,_false,_false>::size(&this->objectsToFree);
  for (; local_20 < uVar1; local_20 = local_20 + 1) {
    ppSVar2 = FastVector<SmallBlock<64>_*,_false,_false>::operator[](&this->objectsToFree,local_20);
    if (((*ppSVar2)->marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)) == 0) {
      Free(this,*ppSVar2);
      e = e + 1;
    }
  }
  FastVector<SmallBlock<64>_*,_false,_false>::clear(&this->objectsToFree);
  *usedMemory = *usedMemory + e * -0x40;
  return e;
}

Assistant:

unsigned FreePending(unsigned &usedMemory)
	{
		unsigned freed = 0;

		for(unsigned i = 0, e = objectsToFree.size(); i < e; i++)
		{
			MySmallBlock *block = objectsToFree[i];

			markerType &marker = block->marker;

			// Check flags again, finalizers might have some objects reachable
			if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
			{
				Free(block);

				freed++;
			}
		}

		objectsToFree.clear();

		usedMemory -= freed * elemSize;

		return freed;
	}